

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcdsp(char *tform,char *cform)

{
  char *pcVar1;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  int ii;
  int local_14;
  
  *in_RSI = '\0';
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if (*(char *)(in_RDI + local_14) != '\0') {
      bVar2 = *(char *)(in_RDI + local_14) == ' ';
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  if (*(char *)(in_RDI + local_14) == '\0') {
    *in_RSI = '\0';
  }
  else {
    pcVar1 = strchr((char *)(in_RDI + local_14),0x25);
    if (pcVar1 == (char *)0x0) {
      *in_RSI = '%';
      strcpy(in_RSI + 1,(char *)(in_RDI + (local_14 + 1)));
      if ((*(char *)(in_RDI + local_14) == 'A') || (*(char *)(in_RDI + local_14) == 'a')) {
        strcat(in_RSI,"s");
      }
      else if ((*(char *)(in_RDI + local_14) == 'I') || (*(char *)(in_RDI + local_14) == 'i')) {
        strcat(in_RSI,"d");
      }
      else if ((*(char *)(in_RDI + local_14) == 'O') || (*(char *)(in_RDI + local_14) == 'o')) {
        strcat(in_RSI,"o");
      }
      else if ((*(char *)(in_RDI + local_14) == 'Z') || (*(char *)(in_RDI + local_14) == 'z')) {
        strcat(in_RSI,"X");
      }
      else if ((*(char *)(in_RDI + local_14) == 'F') || (*(char *)(in_RDI + local_14) == 'f')) {
        strcat(in_RSI,"f");
      }
      else if ((*(char *)(in_RDI + local_14) == 'E') || (*(char *)(in_RDI + local_14) == 'e')) {
        strcat(in_RSI,"E");
      }
      else if ((*(char *)(in_RDI + local_14) == 'D') || (*(char *)(in_RDI + local_14) == 'd')) {
        strcat(in_RSI,"E");
      }
      else if ((*(char *)(in_RDI + local_14) == 'G') || (*(char *)(in_RDI + local_14) == 'g')) {
        strcat(in_RSI,"G");
      }
      else {
        *in_RSI = '\0';
      }
    }
    else {
      *in_RSI = '\0';
    }
  }
  return;
}

Assistant:

void ffcdsp(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS TDISPn display format into the equivalent C format
  suitable for use in a printf statement.
*/
{
    int ii;

    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
    {
        cform[0] = '\0';
        return;    /* input format string was blank */
    }

    if (strchr(tform+ii, '%'))  /* is there a % character in the string?? */
    {
        cform[0] = '\0';
        return;    /* illegal TFORM string (possibly even harmful) */
    }

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[ii + 1]); /* append the width and decimal code */

    if      (tform[ii] == 'A' || tform[ii] == 'a')
        strcat(cform, "s");
    else if (tform[ii] == 'I' || tform[ii] == 'i')
        strcat(cform, "d");
    else if (tform[ii] == 'O' || tform[ii] == 'o')
        strcat(cform, "o");
    else if (tform[ii] == 'Z' || tform[ii] == 'z')
        strcat(cform, "X");
    else if (tform[ii] == 'F' || tform[ii] == 'f')
        strcat(cform, "f");
    else if (tform[ii] == 'E' || tform[ii] == 'e')
        strcat(cform, "E");
    else if (tform[ii] == 'D' || tform[ii] == 'd')
        strcat(cform, "E");
    else if (tform[ii] == 'G' || tform[ii] == 'g')
        strcat(cform, "G");
    else
        cform[0] = '\0';  /* unrecognized tform code */

    return;
}